

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontmetrics.cpp
# Opt level: O0

QRect __thiscall QFontMetrics::boundingRect(QFontMetrics *this,QString *text,QTextOption *option)

{
  long lVar1;
  QRect QVar2;
  qsizetype qVar3;
  QStackTextEngine *in_RSI;
  long in_FS_OFFSET;
  glyph_metrics_t gm;
  QStackTextEngine layout;
  int in_stack_ffffffffffffd5c8;
  QFixed in_stack_ffffffffffffd5cc;
  int in_stack_ffffffffffffd5d0;
  int in_stack_ffffffffffffd5d4;
  QRect *in_stack_ffffffffffffd5d8;
  QStackTextEngine *this_00;
  undefined4 in_stack_ffffffffffffd5e8;
  undefined4 in_stack_ffffffffffffd5ec;
  undefined8 local_29c0;
  undefined8 local_29b8;
  QTextEngine *in_stack_ffffffffffffd758;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  qVar3 = QString::size((QString *)in_RSI);
  if (qVar3 == 0) {
    QRect::QRect((QRect *)CONCAT44(in_stack_ffffffffffffd5d4,in_stack_ffffffffffffd5d0));
  }
  else {
    this_00 = in_RSI;
    QExplicitlySharedDataPointer<QFontPrivate>::data
              ((QExplicitlySharedDataPointer<QFontPrivate> *)0x773908);
    QFont::QFont((QFont *)CONCAT44(in_stack_ffffffffffffd5d4,in_stack_ffffffffffffd5d0),
                 (QFontPrivate *)CONCAT44(in_stack_ffffffffffffd5cc.val,in_stack_ffffffffffffd5c8));
    QStackTextEngine::QStackTextEngine
              (this_00,(QString *)in_stack_ffffffffffffd5d8,
               (QFont *)CONCAT44(in_stack_ffffffffffffd5d4,in_stack_ffffffffffffd5d0));
    QFont::~QFont((QFont *)0x77393f);
    QTextOption::operator=
              ((QTextOption *)CONCAT44(in_stack_ffffffffffffd5ec,in_stack_ffffffffffffd5e8),
               (QTextOption *)this_00);
    QTextEngine::itemize(in_stack_ffffffffffffd758);
    QString::size((QString *)in_RSI);
    QTextEngine::boundingBox
              ((QTextEngine *)CONCAT44(in_stack_ffffffffffffd5ec,in_stack_ffffffffffffd5e8),
               (int)((ulong)this_00 >> 0x20),(int)this_00);
    qRound(in_stack_ffffffffffffd5cc);
    qRound(in_stack_ffffffffffffd5cc);
    qRound(in_stack_ffffffffffffd5cc);
    qRound(in_stack_ffffffffffffd5cc);
    QRect::QRect(in_stack_ffffffffffffd5d8,in_stack_ffffffffffffd5d4,in_stack_ffffffffffffd5d0,
                 in_stack_ffffffffffffd5cc.val,in_stack_ffffffffffffd5c8);
    QStackTextEngine::~QStackTextEngine
              ((QStackTextEngine *)CONCAT44(in_stack_ffffffffffffd5d4,in_stack_ffffffffffffd5d0));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    QVar2._8_8_ = local_29b8;
    QVar2._0_8_ = local_29c0;
    return QVar2;
  }
  __stack_chk_fail();
}

Assistant:

QRect QFontMetrics::boundingRect(const QString &text, const QTextOption &option) const
{
    if (text.size() == 0)
        return QRect();

    Q_DECL_UNINITIALIZED QStackTextEngine layout(text, QFont(d.data()));
    layout.option = option;
    layout.itemize();
    glyph_metrics_t gm = layout.boundingBox(0, text.size());
    return QRect(qRound(gm.x), qRound(gm.y), qRound(gm.width), qRound(gm.height));
}